

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

Token * __thiscall JSON::Parser::readStringToken(Token *__return_storage_ptr__,Parser *this)

{
  string *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *psVar2;
  byte bVar3;
  size_type sVar4;
  undefined8 extraout_RAX;
  int iVar5;
  long lVar6;
  uint unaff_EBP;
  bool bVar7;
  string value;
  undefined1 *local_90;
  undefined8 local_88;
  undefined1 local_80 [16];
  string local_70 [32];
  char *local_50;
  size_type local_48;
  char local_40;
  undefined7 uStack_3f;
  undefined8 uStack_38;
  
  std::__cxx11::string::string((string *)&local_50,"",(allocator *)&local_90);
  sVar4 = local_48;
  __return_storage_ptr__->type = STRING;
  this_00 = &__return_storage_ptr__->value;
  paVar1 = &(__return_storage_ptr__->value).field_2;
  (__return_storage_ptr__->value)._M_dataplus._M_p = (pointer)paVar1;
  if (local_50 == &local_40) {
    paVar1->_M_allocated_capacity = CONCAT71(uStack_3f,local_40);
    *(undefined8 *)((long)&(__return_storage_ptr__->value).field_2 + 8) = uStack_38;
  }
  else {
    (this_00->_M_dataplus)._M_p = local_50;
    paVar1->_M_allocated_capacity = CONCAT71(uStack_3f,local_40);
  }
  local_48 = 0;
  (__return_storage_ptr__->value)._M_string_length = sVar4;
  bVar7 = false;
  local_40 = '\0';
  local_50 = &local_40;
  std::__cxx11::string::~string((string *)&local_50);
  iVar5 = this->pos;
  __return_storage_ptr__->start = iVar5;
  iVar5 = iVar5 + 1;
  this->pos = iVar5;
  local_90 = local_80;
  local_88 = 0;
  local_80[0] = 0;
  psVar2 = &this->input;
  do {
    lVar6 = (long)iVar5;
    while( true ) {
      iVar5 = (int)lVar6;
      if (this->length <= iVar5) {
        if (unaff_EBP != 0x22) {
          unexpected(this,TYPE_STRING,iVar5);
          std::__cxx11::string::~string(local_70);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)this_00);
          _Unwind_Resume(extraout_RAX);
        }
        goto LAB_00104b3d;
      }
      if (!bVar7) break;
      lVar6 = lVar6 + 1;
      this->pos = (int)lVar6;
      bVar7 = false;
    }
    bVar3 = (psVar2->_M_dataplus)._M_p[lVar6];
    unaff_EBP = (uint)bVar3;
    if (bVar3 == 0x5c) {
      std::__cxx11::string::substr((ulong)local_70,(ulong)psVar2);
      std::__cxx11::string::append((string *)&local_90);
      std::__cxx11::string::~string(local_70);
      iVar5 = this->pos;
      bVar7 = true;
    }
    else {
      if (bVar3 == 0x22) {
LAB_00104b3d:
        std::__cxx11::string::substr((ulong)local_70,(ulong)psVar2);
        std::__cxx11::string::append((string *)&local_90);
        std::__cxx11::string::~string(local_70);
        this->pos = this->pos + 1;
        std::__cxx11::string::_M_assign((string *)this_00);
        __return_storage_ptr__->end = this->pos;
        std::__cxx11::string::~string((string *)&local_90);
        return __return_storage_ptr__;
      }
      bVar7 = false;
    }
    iVar5 = iVar5 + 1;
    this->pos = iVar5;
  } while( true );
}

Assistant:

Token Parser::readStringToken() {
        Token token(STRING, "");
        token.start = pos;
        int chunkStart = ++pos;
        int code;
        string value;
        bool isEscapeChar = false;

        while (isValidPos()) {
            if (isEscapeChar) {
                isEscapeChar = false;
                pos++;
                continue;
            }

            code = getCodeAt(pos);
            if (code == 34) { // '"'
                break;
            }
            if (code == 92) { // '\': escape
                isEscapeChar = true;
                value += input.substr(chunkStart, pos - chunkStart);
                chunkStart = ++pos;
            } else {
                pos++;
            }
        }

        if (code != 34) { // '"'
            unexpected(TYPE_STRING, pos);
        }

        value += input.substr(chunkStart, pos - chunkStart);
        pos++;
        token.value = value;
        token.end = pos;
        return token;
    }